

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O1

void ggml_opt_eval_graph(ggml_opt_context_t opt_ctx,ggml_cgraph *graph,ggml_opt_result *result)

{
  size_type __n;
  iterator __position;
  void *pvVar1;
  ggml_init_params params;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  float *pfVar5;
  size_t sVar6;
  ggml_context *ctx;
  ggml_cgraph *cgraph;
  ggml_tensor *pgVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar14 [16];
  float loss;
  vector<int,_std::allocator<int>_> pred;
  int64_t ncorrect;
  undefined8 uVar15;
  undefined8 uVar16;
  float local_ac;
  char *local_a8;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  long local_70 [2];
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 local_58;
  undefined8 local_48;
  ggml_opt_result *local_38;
  
  if (opt_ctx->gf != graph) {
    (*opt_ctx->get_opt_pars)
              ((ggml_opt_optimizer_params *)&stack0xffffffffffffff60,opt_ctx->get_opt_pars_ud);
    if (in_stack_ffffffffffffff60 <= 0.0) {
      pcVar9 = "opt_pars.adamw.alpha > 0.0f";
      iVar3 = 0x24d;
      goto LAB_0012a747;
    }
    if (in_stack_ffffffffffffff64 < 0.0) {
      pcVar9 = "opt_pars.adamw.beta1 >= 0.0f";
      iVar3 = 0x24e;
      goto LAB_0012a747;
    }
    if (1.0 < in_stack_ffffffffffffff64) {
      pcVar9 = "opt_pars.adamw.beta1 <= 1.0f";
      iVar3 = 0x24f;
      goto LAB_0012a747;
    }
    if (in_stack_ffffffffffffff68 < 0.0) {
      pcVar9 = "opt_pars.adamw.beta2 >= 0.0f";
      iVar3 = 0x250;
      goto LAB_0012a747;
    }
    if (1.0 < in_stack_ffffffffffffff68) {
      pcVar9 = "opt_pars.adamw.beta2 <= 1.0f";
      iVar3 = 0x251;
      goto LAB_0012a747;
    }
    if (in_stack_ffffffffffffff6c < 0.0) {
      pcVar9 = "opt_pars.adamw.eps >= 0.0f";
      iVar3 = 0x252;
      goto LAB_0012a747;
    }
    if (in_stack_ffffffffffffff70 < 0.0) {
      pcVar9 = "opt_pars.adamw.wd >= 0.0f";
      iVar3 = 0x253;
      goto LAB_0012a747;
    }
    if (1.0 < in_stack_ffffffffffffff70) {
      pcVar9 = "opt_pars.adamw.wd <= 1.0f";
      iVar3 = 0x254;
      goto LAB_0012a747;
    }
    fVar13 = powf(in_stack_ffffffffffffff64,(float)opt_ctx->iter);
    local_48 = (ggml_hash_set *)CONCAT44(extraout_XMM0_Db,fVar13);
    fVar13 = powf(in_stack_ffffffffffffff68,(float)opt_ctx->iter);
    local_58 = (ggml_opt_context_t)CONCAT44(extraout_XMM0_Db_00,fVar13);
    pfVar5 = ggml_get_data_f32(opt_ctx->adamw_params);
    *pfVar5 = in_stack_ffffffffffffff60;
    pfVar5[1] = in_stack_ffffffffffffff64;
    pfVar5[2] = in_stack_ffffffffffffff68;
    pfVar5[3] = in_stack_ffffffffffffff6c;
    pfVar5[4] = in_stack_ffffffffffffff70;
    auVar14._4_4_ = DAT_0014a0c0._4_4_ - (float)local_58;
    auVar14._0_4_ = (float)DAT_0014a0c0 - (float)local_48;
    auVar14._8_4_ = DAT_0014a0c0._8_4_ - local_48._4_4_;
    auVar14._12_4_ = DAT_0014a0c0._12_4_ - local_58._4_4_;
    auVar14 = divps(_DAT_0014a0c0,auVar14);
    *(long *)(pfVar5 + 5) = auVar14._0_8_;
  }
  if (graph == (ggml_cgraph *)0x0) {
    pcVar9 = "graph";
    iVar3 = 0x10e;
    goto LAB_0012a747;
  }
  if (opt_ctx->allocated_graph != graph) {
    ggml_backend_sched_reset(opt_ctx->backend_sched);
    sVar6 = ggml_tensor_overhead();
    lVar10 = sVar6 << 0xb;
    ggml_free(opt_ctx->ctx_copy);
    local_70[1] = 0;
    local_60 = 1;
    uVar16 = CONCAT71(uStack_5f,1);
    uVar15 = 0;
    params.mem_size._4_4_ = in_stack_ffffffffffffff64;
    params.mem_size._0_4_ = in_stack_ffffffffffffff60;
    params.mem_buffer._0_4_ = in_stack_ffffffffffffff68;
    params.mem_buffer._4_4_ = in_stack_ffffffffffffff6c;
    params._16_4_ = in_stack_ffffffffffffff70;
    params._20_4_ = in_stack_ffffffffffffff74;
    local_70[0] = lVar10;
    ctx = ggml_init(params);
    opt_ctx->ctx_copy = ctx;
    in_stack_ffffffffffffff68 = 0.0;
    in_stack_ffffffffffffff70 = 0.0;
    in_stack_ffffffffffffff74 = 0;
    local_58 = opt_ctx;
    cgraph = ggml_new_graph_custom(ctx,(long)graph->size,true);
    iVar3 = graph->n_leafs;
    if (0 < iVar3) {
      lVar12 = 0;
      do {
        pgVar7 = map_tensor((map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                             *)&stack0xffffffffffffff60,ctx,graph->leafs[lVar12]);
        ggml_build_forward_expand(cgraph,pgVar7);
        lVar12 = lVar12 + 1;
        iVar3 = graph->n_leafs;
      } while (lVar12 < iVar3);
    }
    if (cgraph->n_leafs != iVar3) {
      pcVar9 = "dst->n_leafs == src->n_leafs";
      iVar3 = 0xf8;
LAB_0012a6a8:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,iVar3,"GGML_ASSERT(%s) failed",pcVar9,in_R8,in_R9,lVar10,uVar15,uVar16);
    }
    uVar4 = graph->n_nodes;
    local_38 = result;
    if (0 < (int)uVar4) {
      lVar12 = 0;
      do {
        pgVar7 = map_tensor((map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                             *)&stack0xffffffffffffff60,ctx,graph->nodes[lVar12]);
        ggml_build_forward_expand(cgraph,pgVar7);
        lVar12 = lVar12 + 1;
        uVar4 = graph->n_nodes;
      } while (lVar12 < (int)uVar4);
    }
    if (cgraph->n_nodes != uVar4) {
      pcVar9 = "dst->n_nodes == src->n_nodes";
      iVar3 = 0xfc;
      goto LAB_0012a6a8;
    }
    if (0 < (int)uVar4) {
      local_48 = &graph->visited_hash_set;
      uVar11 = 0;
      local_a8 = "igrad_src != GGML_HASHSET_FULL";
      do {
        sVar6 = ggml_hash_find(local_48,graph->nodes[uVar11]);
        sVar8 = ggml_hash_find(&cgraph->visited_hash_set,cgraph->nodes[uVar11]);
        if (sVar6 == 0xffffffffffffffff) {
          iVar3 = 0x101;
LAB_0012a55d:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                     ,iVar3,"GGML_ASSERT(%s) failed",local_a8);
        }
        if (((graph->visited_hash_set).used[sVar6 >> 5] >> ((uint)sVar6 & 0x1f) & 1) == 0) {
          iVar3 = 0x102;
          local_a8 = "ggml_bitset_get(src->visited_hash_set.used, igrad_src)";
          goto LAB_0012a55d;
        }
        if (sVar8 == 0xffffffffffffffff) {
          iVar3 = 0x103;
          local_a8 = "igrad_dst != GGML_HASHSET_FULL";
          goto LAB_0012a55d;
        }
        if (((cgraph->visited_hash_set).used[sVar8 >> 5] >> ((uint)sVar8 & 0x1f) & 1) == 0) {
          iVar3 = 0x104;
          local_a8 = "ggml_bitset_get(dst->visited_hash_set.used, igrad_dst)";
          goto LAB_0012a55d;
        }
        cgraph->grads[sVar8] = graph->grads[sVar6];
        cgraph->grad_accs[sVar8] = graph->grad_accs[sVar6];
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
    }
    std::
    _Rb_tree<ggml_tensor_*,_std::pair<ggml_tensor_*const,_ggml_tensor_*>,_std::_Select1st<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
    ::~_Rb_tree((_Rb_tree<ggml_tensor_*,_std::pair<ggml_tensor_*const,_ggml_tensor_*>,_std::_Select1st<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                 *)&stack0xffffffffffffff60);
    opt_ctx = local_58;
    local_58->allocated_graph_copy = cgraph;
    ggml_backend_sched_alloc_graph(local_58->backend_sched,cgraph);
    opt_ctx->allocated_graph = graph;
    result = local_38;
  }
  ggml_backend_sched_graph_compute(opt_ctx->backend_sched,opt_ctx->allocated_graph_copy);
  opt_ctx->iter = opt_ctx->iter + (ulong)(opt_ctx->allocated_graph == opt_ctx->gb_opt);
  if (result == (ggml_opt_result *)0x0) {
    return;
  }
  lVar10 = result->ndata;
  if (lVar10 == 0) {
    result->loss_per_datapoint = opt_ctx->loss_per_datapoint;
    result->opt_period = (long)opt_ctx->opt_period;
  }
  else {
    if (result->loss_per_datapoint != opt_ctx->loss_per_datapoint) {
      pcVar9 = "result->loss_per_datapoint == opt_ctx->loss_per_datapoint";
      iVar3 = 0x270;
      goto LAB_0012a747;
    }
    if (result->opt_period != (long)opt_ctx->opt_period) {
      pcVar9 = "result->opt_period == opt_ctx->opt_period";
      iVar3 = 0x271;
      goto LAB_0012a747;
    }
  }
  __n = opt_ctx->outputs->ne[1];
  if (lVar10 == ((long)(result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) * __n) {
    result->ndata = lVar10 + __n;
    _Var2 = ggml_is_scalar(opt_ctx->loss);
    if (_Var2) {
      pgVar7 = opt_ctx->loss;
      if (pgVar7->type == GGML_TYPE_F32) {
        sVar6 = ggml_nbytes(pgVar7);
        ggml_backend_tensor_get(pgVar7,&local_ac,0,sVar6);
        __position._M_current =
             (result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&result->loss,__position,&local_ac);
        }
        else {
          *__position._M_current = local_ac;
          (result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        if (opt_ctx->pred->type == GGML_TYPE_I32) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff60,__n,
                     (allocator_type *)local_70);
          pgVar7 = opt_ctx->pred;
          pvVar1 = (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
          sVar6 = ggml_nbytes(pgVar7);
          ggml_backend_tensor_get(pgVar7,pvVar1,0,sVar6);
          std::vector<int,std::allocator<int>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    ((vector<int,std::allocator<int>> *)&result->pred,
                     (result->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          if ((opt_ctx->labels != (ggml_tensor *)0x0) && (-1 < result->ncorrect)) {
            _Var2 = ggml_is_scalar(opt_ctx->ncorrect);
            if (_Var2) {
              pgVar7 = opt_ctx->ncorrect;
              if (pgVar7->type == GGML_TYPE_I64) {
                sVar6 = ggml_nbytes(pgVar7);
                ggml_backend_tensor_get(pgVar7,local_70,0,sVar6);
                result->ncorrect = result->ncorrect + local_70[0];
                goto LAB_0012a500;
              }
              pcVar9 = "opt_ctx->ncorrect->type == GGML_TYPE_I64";
              iVar3 = 0x289;
            }
            else {
              pcVar9 = "ggml_is_scalar(opt_ctx->ncorrect)";
              iVar3 = 0x288;
            }
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                       ,iVar3,"GGML_ASSERT(%s) failed",pcVar9);
          }
          result->ncorrect = -1;
LAB_0012a500:
          pvVar1 = (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
          if (pvVar1 == (void *)0x0) {
            return;
          }
          operator_delete(pvVar1,CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70) -
                                 (long)pvVar1);
          return;
        }
        pcVar9 = "opt_ctx->pred->type == GGML_TYPE_I32";
        iVar3 = 0x27e;
      }
      else {
        pcVar9 = "opt_ctx->loss->type == GGML_TYPE_F32";
        iVar3 = 0x279;
      }
    }
    else {
      pcVar9 = "ggml_is_scalar(opt_ctx->loss)";
      iVar3 = 0x278;
    }
  }
  else {
    pcVar9 = 
    "result->ndata == ndata*int64_t(result->loss.size()) && \"varying batch size not supported\"";
    iVar3 = 0x275;
  }
LAB_0012a747:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
             ,iVar3,"GGML_ASSERT(%s) failed",pcVar9);
}

Assistant:

static void ggml_opt_eval_graph(ggml_opt_context_t opt_ctx, ggml_cgraph * graph, ggml_opt_result * result) {
    if (graph != opt_ctx->gf) {
        struct ggml_opt_optimizer_params opt_pars = opt_ctx->get_opt_pars(opt_ctx->get_opt_pars_ud);

        GGML_ASSERT(opt_pars.adamw.alpha >  0.0f);
        GGML_ASSERT(opt_pars.adamw.beta1 >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.beta1 <= 1.0f);
        GGML_ASSERT(opt_pars.adamw.beta2 >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.beta2 <= 1.0f);
        GGML_ASSERT(opt_pars.adamw.eps   >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.wd    >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.wd    <= 1.0f);

        // beta1, beta2 after applying warmup
        const float beta1h = 1.0f/(1.0f - powf(opt_pars.adamw.beta1, opt_ctx->iter));
        const float beta2h = 1.0f/(1.0f - powf(opt_pars.adamw.beta2, opt_ctx->iter));

        float * adamw_par_data = ggml_get_data_f32(opt_ctx->adamw_params);
        adamw_par_data[0] = opt_pars.adamw.alpha;
        adamw_par_data[1] = opt_pars.adamw.beta1;
        adamw_par_data[2] = opt_pars.adamw.beta2;
        adamw_par_data[3] = opt_pars.adamw.eps;
        adamw_par_data[4] = opt_pars.adamw.wd;
        adamw_par_data[5] = beta1h;
        adamw_par_data[6] = beta2h;
    }

    ggml_opt_alloc_graph(opt_ctx, graph);
    ggml_backend_sched_graph_compute(opt_ctx->backend_sched, opt_ctx->allocated_graph_copy);
    opt_ctx->iter += opt_ctx->allocated_graph == opt_ctx->gb_opt;

    if (!result) {
        return;
    }

    if (result->ndata == 0) {
        result->loss_per_datapoint = opt_ctx->loss_per_datapoint;
        result->opt_period         = opt_ctx->opt_period;
    } else {
        GGML_ASSERT(result->loss_per_datapoint == opt_ctx->loss_per_datapoint);
        GGML_ASSERT(result->opt_period         == opt_ctx->opt_period);
    }

    const int64_t ndata = opt_ctx->outputs->ne[1];
    GGML_ASSERT(result->ndata == ndata*int64_t(result->loss.size()) && "varying batch size not supported");
    result->ndata += ndata;

    GGML_ASSERT(ggml_is_scalar(opt_ctx->loss));
    GGML_ASSERT(opt_ctx->loss->type == GGML_TYPE_F32);
    float loss;
    ggml_backend_tensor_get(opt_ctx->loss, &loss, 0, ggml_nbytes(opt_ctx->loss));
    result->loss.push_back(loss);

    GGML_ASSERT(opt_ctx->pred->type == GGML_TYPE_I32);
    std::vector<int32_t> pred(ndata);
    ggml_backend_tensor_get(opt_ctx->pred, pred.data(), 0, ggml_nbytes(opt_ctx->pred));
    result->pred.insert(result->pred.end(), pred.begin(), pred.end());

    if (!opt_ctx->labels || result->ncorrect < 0) {
        result->ncorrect = -1;
        return;
    }

    GGML_ASSERT(ggml_is_scalar(opt_ctx->ncorrect));
    GGML_ASSERT(opt_ctx->ncorrect->type == GGML_TYPE_I64);
    int64_t ncorrect;
    ggml_backend_tensor_get(opt_ctx->ncorrect, &ncorrect, 0, ggml_nbytes(opt_ctx->ncorrect));
    result->ncorrect += ncorrect;
}